

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.cpp
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::SymbolMatcher::match
          (SymbolMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *param_3)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint delta;
  uint uVar4;
  
  iVar3 = (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[7])(this,result);
  delta = 0;
  if ((char)iVar3 != '\0') goto LAB_002e51d9;
  if ((ushort)(this->fString).fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_002e5184:
    uVar4 = StringSegment::getCodePoint(segment);
    if ((uVar4 == 0xffffffff) || (UVar2 = UnicodeSet::contains(this->fUniSet,uVar4), UVar2 == '\0'))
    {
      uVar4 = StringSegment::length(segment);
      delta = (uint)(delta == uVar4);
      goto LAB_002e51d9;
    }
    delta = 2 - (uVar4 < 0x10000);
  }
  else {
    delta = StringSegment::getCommonPrefixLength(segment,&this->fString);
    sVar1 = (this->fString).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar4 = (this->fString).fUnion.fFields.fLength;
    }
    else {
      uVar4 = (int)sVar1 >> 5;
    }
    if (delta != uVar4) goto LAB_002e5184;
  }
  StringSegment::adjustOffset(segment,delta);
  (*(this->super_NumberParseMatcher)._vptr_NumberParseMatcher[8])(this,segment,result);
  delta = 0;
LAB_002e51d9:
  return SUB41(delta,0);
}

Assistant:

bool SymbolMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode&) const {
    // Smoke test first; this matcher might be disabled.
    if (isDisabled(result)) {
        return false;
    }

    // Test the string first in order to consume trailing chars greedily.
    int overlap = 0;
    if (!fString.isEmpty()) {
        overlap = segment.getCommonPrefixLength(fString);
        if (overlap == fString.length()) {
            segment.adjustOffset(fString.length());
            accept(segment, result);
            return false;
        }
    }

    int cp = segment.getCodePoint();
    if (cp != -1 && fUniSet->contains(cp)) {
        segment.adjustOffset(U16_LENGTH(cp));
        accept(segment, result);
        return false;
    }

    return overlap == segment.length();
}